

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

bool sc_dt::operator<(long u,sc_signed *v)

{
  sc_digit *psVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  sc_digit ud [3];
  uint auStack_1c [3];
  
  iVar5 = 1;
  if ((u < 1) && (iVar5 = 0, u != 0)) {
    iVar5 = -1;
    u = -u;
  }
  if (u == 0) {
    bVar11 = true;
    uVar8 = 0;
  }
  else {
    uVar3 = 0;
    do {
      auStack_1c[uVar3] = (uint)u & 0x3fffffff;
      uVar8 = uVar3 + 1;
      bVar11 = uVar3 < 2;
      if (!bVar11) break;
      bVar2 = 0x3fffffff < (ulong)u;
      u = (ulong)u >> 0x1e;
      uVar3 = uVar8;
    } while (bVar2);
  }
  if (bVar11) {
    memset(auStack_1c + (uVar8 & 0xffffffff),0,(ulong)(2 - (int)uVar8) * 4 + 4);
  }
  bVar11 = true;
  if (v->sgn <= iVar5) {
    if (iVar5 <= v->sgn) {
      if (iVar5 == -1) {
        uVar7 = v->ndigits;
        psVar1 = v->digit;
        uVar8 = 2;
        uVar4 = 4;
        do {
          if (uVar8 == 0xffffffffffffffff) {
            uVar4 = 0;
            break;
          }
          uVar3 = uVar8 & 0xffffffff;
          uVar8 = uVar8 - 1;
          uVar4 = uVar4 - 1;
        } while (auStack_1c[uVar3] == 0);
        uVar6 = (int)uVar7 >> 0x1f & uVar7;
        uVar9 = uVar7 + 1;
        do {
          uVar10 = uVar6;
          if ((int)uVar7 < 1) break;
          uVar7 = uVar7 - 1;
          uVar9 = uVar9 - 1;
          uVar10 = uVar9;
        } while (psVar1[uVar7] == 0);
        iVar5 = uVar4 - uVar10;
        if (iVar5 == 0) {
          uVar8 = (ulong)uVar4;
          do {
            uVar3 = uVar8;
            uVar7 = ((int)uVar4 >> 0x1f & uVar4) - 1;
            if ((long)uVar3 < 1) break;
            uVar8 = uVar3 - 1;
            uVar7 = (uint)uVar8;
          } while (auStack_1c[uVar8 & 0xffffffff] == psVar1[uVar8 & 0xffffffff]);
          if ((long)uVar3 < 1) {
            iVar5 = 0;
          }
          else {
            iVar5 = auStack_1c[uVar7] - psVar1[uVar7];
          }
        }
        if (0 < iVar5) {
          return true;
        }
      }
      else if (iVar5 == 1) {
        uVar7 = v->ndigits;
        psVar1 = v->digit;
        uVar8 = 2;
        uVar4 = 4;
        do {
          if (uVar8 == 0xffffffffffffffff) {
            uVar4 = 0;
            break;
          }
          uVar3 = uVar8 & 0xffffffff;
          uVar8 = uVar8 - 1;
          uVar4 = uVar4 - 1;
        } while (auStack_1c[uVar3] == 0);
        uVar6 = (int)uVar7 >> 0x1f & uVar7;
        uVar9 = uVar7 + 1;
        do {
          uVar10 = uVar6;
          if ((int)uVar7 < 1) break;
          uVar7 = uVar7 - 1;
          uVar9 = uVar9 - 1;
          uVar10 = uVar9;
        } while (psVar1[uVar7] == 0);
        iVar5 = uVar4 - uVar10;
        if (iVar5 == 0) {
          uVar8 = (ulong)uVar4;
          do {
            uVar3 = uVar8;
            uVar7 = ((int)uVar4 >> 0x1f & uVar4) - 1;
            if ((long)uVar3 < 1) break;
            uVar8 = uVar3 - 1;
            uVar7 = (uint)uVar8;
          } while (auStack_1c[uVar8 & 0xffffffff] == psVar1[uVar8 & 0xffffffff]);
          if ((long)uVar3 < 1) {
            iVar5 = 0;
          }
          else {
            iVar5 = auStack_1c[uVar7] - psVar1[uVar7];
          }
        }
        if (iVar5 < 0) {
          return true;
        }
      }
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool
operator<(long u, const sc_signed& v)
{
  CONVERT_LONG(u);

  if (us < v.sgn)
    return true;

  if (us > v.sgn)
    return false;

  // us == v.sgn

  if (us == SC_POS) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) < 0)
      return true;

  }
  else if (us == SC_NEG) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) > 0)
      return true;

  }

  return false;
}